

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O1

void embree::CollideFunc(void *userPtr,RTCCollision *collisions,uint num_collisions)

{
  RTCCollision *pRVar1;
  pair<unsigned_int,_unsigned_int> *ppVar2;
  iterator __position;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  RTCCollision *pRVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Lock<embree::MutexSys> lock;
  pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_> local_38;
  
  uVar8 = (ulong)num_collisions;
  if (num_collisions == 0) {
    bVar6 = true;
  }
  else {
    uVar9 = 0;
    do {
      bVar6 = intersect_triangle_triangle
                        (collisions[uVar9].geomID0,collisions[uVar9].primID0,
                         collisions[uVar9].geomID1,collisions[uVar9].primID1);
      if (bVar6) {
        uVar9 = uVar9 + 1;
      }
      else {
        pRVar7 = collisions + uVar9;
        uVar8 = (ulong)((int)uVar8 - 1);
        pRVar1 = collisions + uVar8;
        uVar3 = pRVar1->primID0;
        uVar4 = pRVar1->geomID1;
        uVar5 = pRVar1->primID1;
        pRVar7->geomID0 = pRVar1->geomID0;
        pRVar7->primID0 = uVar3;
        pRVar7->geomID1 = uVar4;
        pRVar7->primID1 = uVar5;
      }
    } while (uVar9 < uVar8);
    bVar6 = (int)uVar8 == 0;
  }
  if (!bVar6) {
    MutexSys::lock((MutexSys *)&mutex);
    if (uVar8 != 0) {
      lVar10 = 0;
      do {
        ppVar2 = (pair<unsigned_int,_unsigned_int> *)((long)&collisions->geomID0 + lVar10);
        local_38.first = *ppVar2;
        local_38.second = ppVar2[1];
        __position._M_current =
             *(pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>
               **)((long)userPtr + 8);
        if (__position._M_current ==
            *(pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_> **
             )((long)userPtr + 0x10)) {
          std::
          vector<std::pair<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>>>
          ::
          _M_realloc_insert<std::pair<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>>
                    ((vector<std::pair<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>>>
                      *)userPtr,__position,&local_38);
        }
        else {
          (__position._M_current)->first = local_38.first;
          (__position._M_current)->second = local_38.second;
          *(long *)((long)userPtr + 8) = *(long *)((long)userPtr + 8) + 0x10;
        }
        lVar10 = lVar10 + 0x10;
      } while (uVar8 * 0x10 != lVar10);
    }
    MutexSys::unlock((MutexSys *)&mutex);
  }
  return;
}

Assistant:

void CollideFunc (void* userPtr, RTCCollision* collisions, unsigned int num_collisions)
{
    for (size_t i=0; i<num_collisions;)
    {
      bool intersect = intersect_triangle_triangle(collisions[i].geomID0,collisions[i].primID0,
                                                   collisions[i].geomID1,collisions[i].primID1);
      if (intersect) i++;
      else collisions[i] = collisions[--num_collisions];
    }
  
  if (num_collisions == 0) 
    return;

  Lock<MutexSys> lock(mutex);
  for (size_t i=0; i<num_collisions; i++)
  {
    const unsigned geomID0 = collisions[i].geomID0;
    const unsigned primID0 = collisions[i].primID0;
    const unsigned geomID1 = collisions[i].geomID1;
    const unsigned primID1 = collisions[i].primID1;

    static_cast<Collisions*>(userPtr)->push_back(std::make_pair(std::make_pair(geomID0,primID0),std::make_pair(geomID1,primID1)));
  }
}